

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3-read.c
# Opt level: O1

int mp3_skip_id3v2(file_t *mp3,mp3_frame_t *frame)

{
  undefined4 uVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uchar id3v2_hdr [10];
  char cStack_13;
  char cStack_12;
  uchar local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  byte local_c;
  byte local_b;
  
  if (mp3 == (file_t *)0x0) {
    __assert_fail("mp3 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e3,
                  "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
  }
  if (frame != (mp3_frame_t *)0x0) {
    uVar1 = *(undefined4 *)frame->raw;
    uVar3 = 0;
    if ((((char)uVar1 == 'I') && (cStack_13 = (char)((uint)uVar1 >> 8), cStack_13 == 'D')) &&
       (cStack_12 = (char)((uint)uVar1 >> 0x10), cStack_12 == '3')) {
      iVar4 = file_read(mp3,&local_10,6);
      uVar3 = 0xffffffff;
      if (iVar4 == 6) {
        uVar5 = (ulong)((local_c & 0x7f) << 7 | (local_d & 0x7f) << 0xe | (local_e & 0x7f) << 0x15);
        uVar2 = uVar5 + 10;
        if ((local_f & 0x10) == 0) {
          uVar2 = uVar5;
        }
        iVar4 = file_seek_fwd(mp3,uVar2 + (local_b & 0x7f));
        uVar3 = (uint)(iVar4 != 0);
      }
    }
    return uVar3;
  }
  __assert_fail("frame != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3-read.c",0x2e4,
                "int mp3_skip_id3v2(file_t *, mp3_frame_t *)");
}

Assistant:

int mp3_skip_id3v2(file_t *mp3, mp3_frame_t *frame) {
  assert(mp3 != NULL);
  assert(frame != NULL);

  unsigned char id3v2_hdr[10];
  memcpy(id3v2_hdr, frame->raw, 4);
  if ((id3v2_hdr[0] != 'I') ||
      (id3v2_hdr[1] != 'D') ||
      (id3v2_hdr[2] != '3'))
    return 0;

  if (file_read(mp3, id3v2_hdr + 4, 6) != 6)
    return EEOF;

  /* parse synchsafe integer */
  size_t tag_size = (((id3v2_hdr[6] & 0x7F) << 21) |
                     ((id3v2_hdr[7] & 0x7F) << 14) |
                     ((id3v2_hdr[8] & 0x7F) << 7) |
                     (id3v2_hdr[9] & 0x7F)) +
                    (id3v2_hdr[5] & 0x10 ? 10 : 0);

  if (!file_seek_fwd(mp3, tag_size))
    return 0;

  return 1;
}